

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O3

void __thiscall NTrodeObj::NTrodeObj(NTrodeObj *this)

{
  (this->super_NetworkDataType)._vptr_NetworkDataType = (_func_int **)&PTR__NTrodeObj_003ebd98;
  (this->id)._M_dataplus._M_p = (pointer)&(this->id).field_2;
  (this->id)._M_string_length = 0;
  (this->id).field_2._M_local_buf[0] = '\0';
  (this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->hw_chans).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  std::__cxx11::string::_M_replace((ulong)&this->id,0,(char *)0x0,0x360c54);
  return;
}

Assistant:

NTrodeObj::NTrodeObj() : NetworkDataType() {
    id = "";
}